

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::
ReadReference(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
              *this)

{
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar1;
  
  this_00 = this->reader_;
  pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
  (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
  if (*pcVar1 != 'v') {
    BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,(CStringRef)0x212073);
  }
  DoReadReference(this);
  return;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }